

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Experiment.cpp
# Opt level: O0

double __thiscall Experiment::exp(Experiment *this,double __x)

{
  clock_t cVar1;
  ostream *poVar2;
  ostream *in_RCX;
  short in_DX;
  ushort in_SI;
  double extraout_XMM0_Qa;
  int local_2a4;
  pair<unsigned_short,_int> local_2a0;
  pair<unsigned_int,_unsigned_int> local_298;
  int local_290;
  pair<unsigned_short,_int> local_28c;
  pair<unsigned_int,_unsigned_int> local_284;
  int local_27c;
  pair<unsigned_short,_int> local_278;
  pair<unsigned_int,_unsigned_int> local_270;
  int local_268;
  int local_264;
  uint search_time_kara;
  uint end_time_kara;
  int local_234;
  int local_230;
  uint start_time_kara;
  uint search_time_dc;
  uint end_time_dc;
  int local_1fc;
  int local_1f8;
  uint start_time_dc;
  uint search_time_sch;
  uint end_time_sch;
  int local_1c4;
  undefined1 local_1c0 [4];
  uint start_time_sch;
  Num n2_1;
  Num n1_1;
  int j;
  Short i;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  avr_t_kara;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  avr_t_dc;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  avr_t_sch;
  int local_118;
  int avg_t_kara;
  int avg_t_dc;
  int avg_t_sch;
  karatsubaMultiplication kara;
  divideAndConquer dac;
  gradeSchoolMultiplication gsm;
  Num n5;
  Num n4;
  Num n3;
  undefined1 local_70 [8];
  Num n2;
  Num n1;
  ofstream *out_local;
  Short step_local;
  Short k_local;
  Experiment *this_local;
  
  Num::Num((Num *)&n2.field_0x20);
  Num::Num((Num *)local_70);
  Num::Num((Num *)&n4.field_0x20);
  Num::Num((Num *)&n5.field_0x20);
  Num::Num((Num *)&gsm);
  gradeSchoolMultiplication::gradeSchoolMultiplication((gradeSchoolMultiplication *)&dac);
  divideAndConquer::divideAndConquer((divideAndConquer *)&kara);
  karatsubaMultiplication::karatsubaMultiplication((karatsubaMultiplication *)&avg_t_dc);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            *)&avr_t_dc.
               super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            *)&avr_t_kara.
               super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            *)&j);
  for (n1_1._38_2_ = 0; (ushort)n1_1._38_2_ < in_SI; n1_1._38_2_ = n1_1._38_2_ + in_DX) {
    avg_t_kara = 0;
    local_118 = 0;
    avr_t_sch.
    super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    for (n1_1._32_4_ = 0; (int)n1_1._32_4_ < 3; n1_1._32_4_ = n1_1._32_4_ + 1) {
      Num::createNumber((Num *)&n2_1.field_0x20,(Num *)&n2_1.field_0x20,n1_1._38_2_);
      Num::createNumber((Num *)local_1c0,(Num *)local_1c0,n1_1._38_2_);
      cVar1 = clock();
      local_1c4 = (int)cVar1;
      gradeSchoolMultiplication::multiply
                ((Num *)&search_time_sch,(gradeSchoolMultiplication *)&dac,(Num *)&n2_1.field_0x20,
                 (Num *)local_1c0);
      Num::operator=((Num *)&n4.field_0x20,(Num *)&search_time_sch);
      Num::~Num((Num *)&search_time_sch);
      cVar1 = clock();
      start_time_dc = (uint)cVar1;
      local_1f8 = start_time_dc - local_1c4;
      avg_t_kara = avg_t_kara + local_1f8;
      cVar1 = clock();
      local_1fc = (int)cVar1;
      divideAndConquer::multiply
                ((Num *)&search_time_dc,(divideAndConquer *)&kara,(Num *)&n2_1.field_0x20,
                 (Num *)local_1c0);
      Num::operator=((Num *)&n5.field_0x20,(Num *)&search_time_dc);
      Num::~Num((Num *)&search_time_dc);
      cVar1 = clock();
      start_time_kara = (uint)cVar1;
      local_230 = start_time_kara - local_1fc;
      local_118 = local_118 + local_230;
      cVar1 = clock();
      local_234 = (int)cVar1;
      karatsubaMultiplication::multiply
                ((Num *)&search_time_kara,(karatsubaMultiplication *)&avg_t_dc,
                 (Num *)&n2_1.field_0x20,(Num *)local_1c0);
      Num::operator=((Num *)&gsm,(Num *)&search_time_kara);
      Num::~Num((Num *)&search_time_kara);
      cVar1 = clock();
      local_264 = (int)cVar1;
      local_268 = local_264 - local_234;
      avr_t_sch.
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
           local_268 +
           avr_t_sch.
           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
      Num::~Num((Num *)local_1c0);
      Num::~Num((Num *)&n2_1.field_0x20);
    }
    local_27c = avg_t_kara / 3;
    local_278 = std::make_pair<unsigned_short&,int>((unsigned_short *)&n1_1.field_0x26,&local_27c);
    std::pair<unsigned_int,_unsigned_int>::pair<unsigned_short,_int,_true>(&local_270,&local_278);
    std::
    vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
    ::push_back((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 *)&avr_t_dc.
                    super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_270);
    local_290 = local_118 / 3;
    local_28c = std::make_pair<unsigned_short&,int>((unsigned_short *)&n1_1.field_0x26,&local_290);
    std::pair<unsigned_int,_unsigned_int>::pair<unsigned_short,_int,_true>(&local_284,&local_28c);
    std::
    vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
    ::push_back((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 *)&avr_t_kara.
                    super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_284);
    local_2a4 = avr_t_sch.
                super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ / 3;
    local_2a0 = std::make_pair<unsigned_short&,int>((unsigned_short *)&n1_1.field_0x26,&local_2a4);
    std::pair<unsigned_int,_unsigned_int>::pair<unsigned_short,_int,_true>(&local_298,&local_2a0);
    std::
    vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
    ::push_back((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 *)&j,&local_298);
    poVar2 = (ostream *)std::ostream::operator<<(in_RCX,n1_1._38_2_);
    poVar2 = std::operator<<(poVar2,", ");
    std::ostream::operator<<(poVar2,avg_t_kara / 3);
    poVar2 = std::operator<<(in_RCX,", ");
    std::ostream::operator<<(poVar2,local_118 / 3);
    poVar2 = std::operator<<(in_RCX,", ");
    poVar2 = (ostream *)
             std::ostream::operator<<
                       (poVar2,avr_t_sch.
                               super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ / 3);
    std::operator<<(poVar2,"\n");
  }
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
             *)&j);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
             *)&avr_t_kara.
                super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
             *)&avr_t_dc.
                super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  karatsubaMultiplication::~karatsubaMultiplication((karatsubaMultiplication *)&avg_t_dc);
  divideAndConquer::~divideAndConquer((divideAndConquer *)&kara);
  gradeSchoolMultiplication::~gradeSchoolMultiplication((gradeSchoolMultiplication *)&dac);
  Num::~Num((Num *)&gsm);
  Num::~Num((Num *)&n5.field_0x20);
  Num::~Num((Num *)&n4.field_0x20);
  Num::~Num((Num *)local_70);
  Num::~Num((Num *)&n2.field_0x20);
  return extraout_XMM0_Qa;
}

Assistant:

void Experiment::exp(Num::Short k, Num::Short step, std::ofstream& out)
{

    Num n1, n2,n3,n4,n5;

    gradeSchoolMultiplication gsm;
    divideAndConquer dac;
    karatsubaMultiplication kara;



    int avg_t_sch, avg_t_dc, avg_t_kara;

    std::vector  <std::pair<unsigned int,unsigned int>> avr_t_sch;
    std::vector  <std::pair<unsigned int, unsigned int>> avr_t_dc;
    std::vector  <std::pair<unsigned int, unsigned int>> avr_t_kara;


    for (Num::Short i = 0; i < k; i+=step)
    {
        avg_t_sch = 0;
        avg_t_dc = 0;
        avg_t_kara = 0;


            for (int j = 0; j <3; j++)
            {
                Num n1 = n1.createNumber(i);
                Num n2 = n2.createNumber(i);

                unsigned int start_time_sch =  clock();
                n3 = gsm.multiply(n1, n2);
                unsigned int end_time_sch = clock(); // finish time
                unsigned int search_time_sch = end_time_sch - start_time_sch; // overall time
                avg_t_sch += search_time_sch;

                unsigned int start_time_dc =  clock();
                n4 = dac.multiply(n1, n2);
                unsigned int end_time_dc = clock(); // finish time
                unsigned int search_time_dc = end_time_dc - start_time_dc; // overall time
                avg_t_dc += search_time_dc;

                unsigned int start_time_kara =  clock();
                n5 = kara.multiply(n1, n2);
                unsigned int end_time_kara = clock(); // finish time
                unsigned int search_time_kara = end_time_kara - start_time_kara; // overall time
                avg_t_kara += search_time_kara;
            }



        avr_t_sch.push_back(std::make_pair(i, avg_t_sch/3));
        avr_t_dc.push_back(std::make_pair(i, avg_t_dc/3));
        avr_t_kara.push_back(std::make_pair(i, avg_t_kara/3));

        out << i << ", " << avg_t_sch/3;
        out  << ", " << avg_t_dc/3;
        out << ", " << avg_t_kara/3<< "\n";
    }

}